

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall
QComboBoxPrivate::rowsRemoved(QComboBoxPrivate *this,QModelIndex *parent,int param_2,int param_3)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  long *plVar2;
  QLineEdit *this_01;
  char cVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  cVar3 = comparesEqual(&this->root,parent);
  if (cVar3 != '\0') {
    if (this->sizeAdjustPolicy == AdjustToContents) {
      (this->sizeHint).wd = -1;
      (this->sizeHint).ht = -1;
      adjustComboBoxSize(this);
      QWidget::updateGeometry(this_00);
    }
    pQVar1 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->root);
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_48);
    if (iVar4 == 0) {
      local_48._0_8_ = (QArrayData *)0xffffffffffffffff;
      local_48.i = 0;
      local_48.m.ptr = (QAbstractItemModel *)0x0;
      setCurrentIndex(this,&local_48);
    }
    else {
      iVar4 = QPersistentModelIndex::row();
      if (iVar4 != this->indexBeforeChange) {
        cVar3 = QPersistentModelIndex::isValid();
        if (cVar3 == '\0') {
          plVar2 = *(long **)(*(long *)&this_00->field_0x8 + 0x298);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_48,(QPersistentModelIndex *)(*(long *)&this_00->field_0x8 + 0x2c0));
          iVar4 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_48);
          if (iVar4 != 0) {
            plVar2 = *(long **)(*(long *)&this_00->field_0x8 + 0x298);
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_48,(QPersistentModelIndex *)(*(long *)&this_00->field_0x8 + 0x2c0));
            iVar5 = (**(code **)(*plVar2 + 0x78))(plVar2);
            iVar4 = 0;
            if (0 < this->indexBeforeChange) {
              iVar4 = this->indexBeforeChange;
            }
            if (iVar5 + -1 < iVar4) {
              iVar4 = iVar5 + -1;
            }
            QComboBox::setCurrentIndex((QComboBox *)this_00,iVar4);
            goto LAB_003de648;
          }
        }
        this_01 = this->lineEdit;
        if (this_01 != (QLineEdit *)0x0) {
          iVar4 = QPersistentModelIndex::row();
          QComboBox::itemText((QString *)&local_48,(QComboBox *)this_00,iVar4);
          QLineEdit::setText(this_01,(QString *)&local_48);
          if ((QArrayData *)local_48._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
            }
          }
          updateLineEditGeometry(this);
        }
        QWidget::update(this_00);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->currentIndex);
        emitCurrentIndexChanged(this,&local_48);
      }
    }
  }
LAB_003de648:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::rowsRemoved(const QModelIndex &parent, int /*start*/, int /*end*/)
{
    Q_Q(QComboBox);
    if (parent != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    // model has removed the last row
    if (model->rowCount(root) == 0) {
        setCurrentIndex(QModelIndex());
        return;
    }

    // model has changed the currentIndex
    if (currentIndex.row() != indexBeforeChange) {
        if (!currentIndex.isValid() && q->count()) {
            q->setCurrentIndex(qMin(q->count() - 1, qMax(indexBeforeChange, 0)));
            return;
        }
        if (lineEdit) {
            lineEdit->setText(q->itemText(currentIndex.row()));
            updateLineEditGeometry();
        }
        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}